

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  bool bVar1;
  int *piVar2;
  size_t __n;
  char *message;
  int i;
  int local_5c;
  char local_58 [4];
  int copy;
  char w [66];
  LogMessage *this_local;
  
  unique0x1000056d = this;
  ::glog_internal_namespace_::Mutex::AssertHeld((Mutex *)log_mutex);
  if ((this->data_->num_chars_to_log_ == 0) ||
     (this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n')) {
    RawLog__(3,"/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
             ,0x5a0,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
             ,"");
  }
  if (((SendToLog::already_warned_before_initgoogle & 1U) == 0) &&
     (bVar1 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar1)) {
    memcpy(local_58,"WARNING: Logging before InitGoogleLogging() is written to STDERR\n",0x42);
    WriteToStderr(local_58,0x41);
    SendToLog::already_warned_before_initgoogle = true;
  }
  if (((fLB::FLAGS_logtostderr & 1) == 0) &&
     (bVar1 = glog_internal_namespace_::IsGoogleLoggingInitialized(), bVar1)) {
    LogDestination::LogToAllLogfiles
              ((int)this->data_->severity_,this->data_->timestamp_,this->data_->message_text_,
               this->data_->num_chars_to_log_);
    LogDestination::MaybeLogToStderr
              ((int)this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_
              );
    LogDestination::MaybeLogToEmail
              ((int)this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_
              );
    LogDestination::LogToSinks
              ((int)this->data_->severity_,this->data_->fullname_,this->data_->basename_,
               this->data_->line_,&this->data_->tm_time_,
               this->data_->message_text_ + this->data_->num_prefix_chars_,
               (this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_) - 1);
  }
  else {
    ColoredWriteToStderr
              ((int)this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_
              );
    LogDestination::LogToSinks
              ((int)this->data_->severity_,this->data_->fullname_,this->data_->basename_,
               this->data_->line_,&this->data_->tm_time_,
               this->data_->message_text_ + this->data_->num_prefix_chars_,
               (this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_) - 1);
  }
  if ((this->data_->severity_ == '\x03') && ((exit_on_dfatal & 1) != 0)) {
    if ((this->data_->first_fatal_ & 1U) != 0) {
      RecordCrashReason(this,(CrashReason *)crash_reason);
      glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      i = (int)this->data_->num_chars_to_log_;
      message._4_4_ = 0xff;
      piVar2 = std::min<int>(&i,(int *)((long)&message + 4));
      local_5c = *piVar2;
      memcpy(&fatal_message,this->data_->message_text_,(long)local_5c);
      (&fatal_message)[local_5c] = 0;
      fatal_time = this->data_->timestamp_;
    }
    if ((fLB::FLAGS_logtostderr & 1) == 0) {
      for (message._0_4_ = 0; (int)message < 4; message._0_4_ = (int)message + 1) {
        if (*(long *)(LogDestination::log_destinations_ + (long)(int)message * 8) != 0) {
          (**(code **)(**(long **)(*(long *)(LogDestination::log_destinations_ +
                                            (long)(int)message * 8) + 0xd8) + 0x10))
                    (*(long **)(*(long *)(LogDestination::log_destinations_ + (long)(int)message * 8
                                         ) + 0xd8),1,0,"",0);
        }
      }
    }
    ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
    LogDestination::WaitForSinks(this->data_);
    __n = strlen("*** Check failure stack trace: ***\n");
    write(2,"*** Check failure stack trace: ***\n",__n);
    Fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1));
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}